

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void operator_suite::less(void)

{
  bool bVar1;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  iterator_type local_88;
  basic_iterator<int> local_78;
  circular_view<int,_18446744073709551615UL> local_68;
  type local_48 [6];
  
  local_68.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_68.member.cap = 4;
  local_68.member.size = 0;
  local_68.member.next = 4;
  local_78.parent = (view_pointer)0x160000000b;
  local_78.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_68,input);
  local_88.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_78.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_78.current = local_88.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_88.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_88.current = local_88.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x524,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x525,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x526,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x527,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x528,"void operator_suite::less()",bVar1);
  local_88.current = local_68.member.cap * 2;
  uVar4 = local_88.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_78.current = local_88.current - 1 & local_68.member.next;
  }
  else {
    local_78.current = local_68.member.next % local_88.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_88.current = local_68.member.next - local_68.member.size & local_88.current - 1;
  }
  else {
    local_88.current = (local_68.member.next - local_68.member.size) % local_88.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52a,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52b,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52c,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52d,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52e,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x37;
  local_88.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_78.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_78.current = local_88.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_88.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_88.current = local_88.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x531,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x532,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x533,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x534,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x535,"void operator_suite::less()",bVar1);
  local_88.current = local_68.member.cap * 2;
  uVar4 = local_88.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_78.current = local_88.current - 1 & local_68.member.next;
  }
  else {
    local_78.current = local_68.member.next % local_88.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_88.current = local_68.member.next - local_68.member.size & local_88.current - 1;
  }
  else {
    local_88.current = (local_68.member.next - local_68.member.size) % local_88.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x537,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x538,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x539,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53a,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53b,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x42;
  local_88.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_78.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_78.current = local_88.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_88.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_88.current = local_88.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53e,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53f,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x540,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x541,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x542,"void operator_suite::less()",bVar1);
  local_88.current = local_68.member.cap * 2;
  uVar4 = local_88.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_78.current = local_88.current - 1 & local_68.member.next;
  }
  else {
    local_78.current = local_68.member.next % local_88.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_88.current = local_68.member.next - local_68.member.size & local_88.current - 1;
  }
  else {
    local_88.current = (local_68.member.next - local_68.member.size) % local_88.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x544,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x545,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x546,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x547,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x548,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x4d;
  local_88.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_78.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_78.current = local_88.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_88.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_88.current = local_88.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54b,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54c,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54d,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54e,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54f,"void operator_suite::less()",bVar1);
  local_88.current = local_68.member.cap * 2;
  uVar4 = local_88.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_78.current = local_88.current - 1 & local_68.member.next;
  }
  else {
    local_78.current = local_68.member.next % local_88.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_88.current = local_68.member.next - local_68.member.size & local_88.current - 1;
  }
  else {
    local_88.current = (local_68.member.next - local_68.member.size) % local_88.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x551,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x552,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x553,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x554,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x555,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x58;
  local_88.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_78.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_78.current = local_88.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_88.current = uVar4 - 1 & local_88.current;
  }
  else {
    local_88.current = local_88.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x558,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x559,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55a,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55b,"void operator_suite::less()",bVar1);
  local_78.current = local_68.member.next - local_68.member.size;
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_88.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_88.current = local_78.current % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_78.current = uVar4 - 1 & local_78.current;
  }
  else {
    local_78.current = local_78.current % uVar4;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55c,"void operator_suite::less()",bVar1);
  local_88.current = local_68.member.cap * 2;
  uVar4 = local_88.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_78.current = local_88.current - 1 & local_68.member.next;
  }
  else {
    local_78.current = local_68.member.next % local_88.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_88.current = local_68.member.next - local_68.member.size & local_88.current - 1;
  }
  else {
    local_88.current = (local_68.member.next - local_68.member.size) % local_88.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55e,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55f,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x560,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x561,"void operator_suite::less()",!bVar1);
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_88.current = local_68.member.next % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_68.member.next - local_68.member.size & local_78.current - 1;
  }
  else {
    local_78.current = (local_68.member.next - local_68.member.size) % local_78.current;
  }
  local_88.parent = &local_68;
  local_78.parent = &local_68;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_78,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x562,"void operator_suite::less()",!bVar1);
  return;
}

Assistant:

void less()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(55);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(66);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(77);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(88);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));
}